

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O2

path * helper::resolve(path *__return_storage_ptr__,path *p,path *base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  path absolute;
  iterator it;
  path local_e0;
  iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
  local_c0 [32];
  long local_a0;
  long local_98;
  string local_90 [32];
  long local_70;
  long local_68;
  type local_60;
  
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  boost::filesystem::absolute(&local_e0,p,base);
  boost::filesystem::path::begin();
  do {
    boost::filesystem::path::end();
    lVar4 = local_68;
    lVar3 = local_70;
    lVar2 = local_98;
    lVar1 = local_a0;
    std::__cxx11::string::~string(local_90);
    if ((lVar1 == lVar3) && (lVar2 == lVar4)) {
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      return __return_storage_ptr__;
    }
    bVar5 = boost::filesystem::operator==((path *)local_c0,"..");
    if (bVar5) {
      bVar5 = boost::filesystem::is_symlink(__return_storage_ptr__);
      if (!bVar5) {
        boost::filesystem::path::filename();
        bVar5 = boost::filesystem::operator==((path *)local_90,"..");
        std::__cxx11::string::~string(local_90);
        if (!bVar5) {
          boost::filesystem::path::parent_path();
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_90);
          std::__cxx11::string::~string(local_90);
          goto LAB_00170b77;
        }
      }
LAB_00170b6c:
      boost::filesystem::path::operator/=(__return_storage_ptr__,(path *)local_c0);
    }
    else {
      bVar5 = boost::filesystem::operator==((path *)local_c0,".");
      if (!bVar5) goto LAB_00170b6c;
    }
LAB_00170b77:
    boost::iterators::operator++(&local_60,local_c0,0);
    std::__cxx11::string::~string((string *)&local_60);
  } while( true );
}

Assistant:

fs::path resolve( const fs::path &p, const fs::path &base )
	{
		fs::path ret;
		fs::path absolute = fs::absolute( p, base );

		for( fs::path::iterator it = absolute.begin() ; it != absolute.end() ; it++ )
		{
			if( *it == ".." )
			{//Go one dir backwars
				if( fs::is_symlink( ret ) )
				{//Check for symlinks
					ret /= *it;
				}
				else if( ret.filename() == ".." )
				{//Multiple ..s'
					ret /= *it;
				}
				// Otherwise it should be safe to resolve the parent
				else
					ret = ret.parent_path();
			}
			else if( *it == "." );//Ignore
			else
			{//Normal dirs
				ret /= *it;
			}
		}
		return ret;
	}